

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_flush(Curl_easy *data,_Bool unpause,_Bool flush_all)

{
  cw_out_ctx *ctx_00;
  cw_out_ctx *ctx;
  CURLcode result;
  Curl_cwriter *cw_out;
  _Bool flush_all_local;
  _Bool unpause_local;
  Curl_easy *data_local;
  
  ctx._4_4_ = CURLE_OK;
  ctx_00 = (cw_out_ctx *)Curl_cwriter_get_by_type(data,&Curl_cwt_out);
  if (ctx_00 != (cw_out_ctx *)0x0) {
    if (((byte)ctx_00->field_0x28 >> 1 & 1) != 0) {
      return CURLE_WRITE_ERROR;
    }
    if ((unpause) && ((ctx_00->field_0x28 & 1) != 0)) {
      ctx_00->field_0x28 = ctx_00->field_0x28 & 0xfe;
    }
    if ((ctx_00->field_0x28 & 1) != 0) {
      return CURLE_OK;
    }
    ctx._4_4_ = cw_out_flush_chain(ctx_00,data,&ctx_00->buf,flush_all);
    if (ctx._4_4_ != CURLE_OK) {
      ctx_00->field_0x28 = ctx_00->field_0x28 & 0xfd | 2;
      cw_out_bufs_free(ctx_00);
      return ctx._4_4_;
    }
  }
  return ctx._4_4_;
}

Assistant:

static CURLcode cw_out_flush(struct Curl_easy *data,
                             bool unpause, bool flush_all)
{
  struct Curl_cwriter *cw_out;
  CURLcode result = CURLE_OK;

  cw_out = Curl_cwriter_get_by_type(data, &Curl_cwt_out);
  if(cw_out) {
    struct cw_out_ctx *ctx = (struct cw_out_ctx *)cw_out;
    if(ctx->errored)
      return CURLE_WRITE_ERROR;
    if(unpause && ctx->paused)
      ctx->paused = FALSE;
    if(ctx->paused)
      return CURLE_OK;  /* not doing it */

    result = cw_out_flush_chain(ctx, data, &ctx->buf, flush_all);
    if(result) {
      ctx->errored = TRUE;
      cw_out_bufs_free(ctx);
      return result;
    }
  }
  return result;
}